

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O2

int32_t __thiscall
icu_63::GregorianCalendar::handleGetMonthLength
          (GregorianCalendar *this,int32_t extendedYear,int32_t month)

{
  UBool UVar1;
  int32_t iVar2;
  int8_t *piVar3;
  int32_t month_local;
  
  month_local = month;
  if (0xb < (uint)month) {
    iVar2 = ClockMath::floorDivide((double)month,0xc,&month_local);
    extendedYear = extendedYear + iVar2;
  }
  iVar2 = month_local;
  UVar1 = isLeapYear(this,extendedYear);
  piVar3 = "\x1f\x1c\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f";
  if (UVar1 != '\0') {
    piVar3 = "\x1f\x1d\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f";
  }
  return (int)piVar3[iVar2];
}

Assistant:

int32_t GregorianCalendar::handleGetMonthLength(int32_t extendedYear, int32_t month)  const
{
    // If the month is out of range, adjust it into range, and
    // modify the extended year value accordingly.
    if (month < 0 || month > 11) {
        extendedYear += ClockMath::floorDivide(month, 12, month);
    }

    return isLeapYear(extendedYear) ? kLeapMonthLength[month] : kMonthLength[month];
}